

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilePOSIX.cpp
# Opt level: O2

void __thiscall adios2::transport::FilePOSIX::WaitForOpen(FilePOSIX *this)

{
  int iVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  if (this->m_IsOpening == true) {
    if ((this->m_OpenFuture).super___basic_future<int>._M_state.
        super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      iVar1 = std::future<int>::get(&this->m_OpenFuture);
      this->m_FileDescriptor = iVar1;
    }
    this->m_IsOpening = false;
    std::operator+(&local_30,"couldn\'t open file ",&(this->super_Transport).m_Name);
    std::operator+(&local_50,&local_30,", in call to POSIX open");
    CheckFile(this,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_30);
    (this->super_Transport).m_IsOpen = true;
  }
  return;
}

Assistant:

void FilePOSIX::WaitForOpen()
{
    if (m_IsOpening)
    {
        if (m_OpenFuture.valid())
        {
            m_FileDescriptor = m_OpenFuture.get();
        }
        m_IsOpening = false;
        CheckFile("couldn't open file " + m_Name + ", in call to POSIX open");
        m_IsOpen = true;
    }
}